

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

bool __thiscall brynet::net::EventLoop::linkChannel(EventLoop *this,sock fd,Channel *ptr)

{
  int iVar1;
  undefined1 local_2c [8];
  epoll_event ev;
  Channel *ptr_local;
  sock fd_local;
  EventLoop *this_local;
  
  ev.data = (epoll_data_t)ptr;
  memset(local_2c,0,0xc);
  local_2c._0_4_ = 0x80002001;
  stack0xffffffffffffffd8 = ev.data;
  iVar1 = epoll_ctl(this->mEpollFd,1,fd,(epoll_event *)local_2c);
  return iVar1 == 0;
}

Assistant:

bool EventLoop::linkChannel(sock fd, Channel* ptr)
{
#ifdef PLATFORM_WINDOWS
    return CreateIoCompletionPort((HANDLE)fd, mIOCP, (ULONG_PTR)ptr, 0) != nullptr;
#else
    struct epoll_event ev = { 0, { 0 } };
    ev.events = EPOLLET | EPOLLIN | EPOLLRDHUP;
    ev.data.ptr = ptr;
    return epoll_ctl(mEpollFd, EPOLL_CTL_ADD, fd, &ev) == 0;
#endif
}